

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_filter.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint8_t *__filename;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  size_t sVar10;
  clock_t cVar11;
  FILE *__stream;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  void *__addr;
  clock_t cVar16;
  bool bVar17;
  ulong uVar18;
  ulong uVar19;
  uint8_t *block;
  uint8_t *src;
  ulong uVar20;
  char *pcVar21;
  uint uVar22;
  uint64_t uVar23;
  ulong local_128;
  uint64_t seed;
  uint64_t BlockLength;
  uint8_t *local_110;
  clock_t local_108;
  uint64_t cookie;
  char tmp [48];
  SHA1 local_c8;
  uint32_t digest [5];
  
  bVar4 = false;
  do {
    bVar17 = bVar4;
    iVar5 = getopt(argc,argv,"hs");
    bVar4 = true;
  } while (iVar5 == 0x73);
  if (iVar5 != -1) {
    printusage(*argv);
    return 0;
  }
  if (argc <= _optind + 1) {
    printusage(*argv);
    return -1;
  }
  __filename = (uint8_t *)argv[_optind];
  printf("using database: %s\n",__filename);
  if (bVar17) {
    puts("We are going to hash your input.");
    local_c8._vptr_SHA1 = (_func_int **)&PTR__SHA1_00103da0;
    local_c8.m_digest[0] = 0x67452301;
    local_c8.m_digest[1] = 0xefcdab89;
    local_c8.m_digest[2] = 0x98badcfe;
    local_c8.m_digest[3] = 0x10325476;
    local_c8.m_digest[4] = 0xc3d2e1f0;
    local_c8.m_blockByteIndex = 0;
    local_c8.m_byteCount = 0;
    pcVar21 = argv[(long)_optind + 1];
    sVar10 = strlen(pcVar21);
    printf("hashing this word: %s (length in bytes = %zu)\n",pcVar21,sVar10);
    sVar10 = strlen(pcVar21);
    sha1::SHA1::processBlock(&local_c8,pcVar21,pcVar21 + sVar10);
    sha1::SHA1::getDigest(&local_c8,digest);
    uVar18 = (ulong)digest._8_8_ >> 0x20;
    uVar19 = stack0xffffffffffffffb8 & 0xffffffff;
    snprintf(tmp,0x2d,"%08x %08x %08x %08x %08x",digest._0_8_ & 0xffffffff,
             (ulong)digest._0_8_ >> 0x20);
    printf("SHA1 hash %s\n",tmp,uVar19,uVar18);
    uVar23 = CONCAT44(digest[0],digest[1]);
  }
  else {
    src = (uint8_t *)argv[(long)_optind + 1];
    sVar10 = strlen((char *)src);
    if (sVar10 != 0x10) {
      printf("bad hex. length is %zu, 16 hexadecimal characters expected.\n",sVar10);
      printusage(*argv);
      return 1;
    }
    uVar6 = hex_to_u32_nocheck(src);
    uVar7 = hex_to_u32_nocheck(src + 4);
    uVar8 = hex_to_u32_nocheck(src + 8);
    uVar9 = hex_to_u32_nocheck(src + 0xc);
    if (0xffff < (uVar8 | uVar9 | uVar7 | uVar6)) {
      pcVar21 = "bad hex value  %s \n";
      goto LAB_00101880;
    }
    uVar23 = (ulong)uVar8 << 0x10 | (ulong)uVar9 | (ulong)uVar7 << 0x20 | (ulong)uVar6 << 0x30;
  }
  printf("hexval = 0x%lx\n",uVar23);
  cookie = 0;
  seed = 0;
  BlockLength = 0;
  cVar11 = clock();
  __stream = fopen((char *)__filename,"rb");
  if (__stream == (FILE *)0x0) {
    pcVar21 = "Cannot read the input file %s.";
    src = __filename;
LAB_00101880:
    printf(pcVar21,src);
    return 1;
  }
  sVar10 = fread(&cookie,8,1,__stream);
  if (sVar10 != 1) {
    puts("failed read.");
  }
  sVar10 = fread(&seed,8,1,__stream);
  if (sVar10 != 1) {
    puts("failed read.");
  }
  local_110 = __filename;
  local_108 = cVar11;
  switch(cookie) {
  case 0x12d687:
    sVar10 = fread(&BlockLength,8,1,__stream);
    if (sVar10 != 1) {
      puts("failed read.");
    }
    local_128 = BlockLength;
    sVar10 = BlockLength * 3 + 0x18;
    bVar4 = true;
    pcVar21 = "Xor filter detected.";
    break;
  case 0x12d688:
    sVar10 = fread(&BlockLength,8,1,__stream);
    if (sVar10 != 1) {
      puts("failed read.");
    }
    local_128 = BlockLength;
    sVar10 = BlockLength * 8 + 0x18;
    bVar3 = true;
    pcVar21 = "Bloom filter detected.";
    bVar4 = false;
    bVar17 = false;
    goto LAB_00101702;
  case 0x12d689:
    local_c8._vptr_SHA1 = (_func_int **)seed;
    sVar10 = fread(local_c8.m_digest,4,1,__stream);
    sVar12 = fread(local_c8.m_digest + 1,4,1,__stream);
    sVar13 = fread(local_c8.m_digest + 2,4,1,__stream);
    sVar14 = fread(local_c8.m_digest + 3,4,1,__stream);
    sVar15 = fread(local_c8.m_digest + 4,4,1,__stream);
    if (((uint)sVar15 & (uint)sVar14 & (uint)sVar13 & (uint)sVar12 & (uint)sVar10 & 1) == 0) {
      puts("failed read.");
    }
    sVar10 = (ulong)local_c8.m_digest[4] + 0x24;
    pcVar21 = "8-bit binary fuse filter detected.";
    local_128 = 0;
    bVar4 = false;
    break;
  case 0x12d68a:
    tmp[0] = (undefined1)seed;
    tmp[1] = seed._1_1_;
    tmp[2] = seed._2_1_;
    tmp[3] = seed._3_1_;
    tmp[4] = seed._4_1_;
    tmp[5] = seed._5_1_;
    tmp[6] = seed._6_1_;
    tmp[7] = seed._7_1_;
    sVar10 = fread(tmp + 8,4,1,__stream);
    sVar12 = fread(tmp + 0xc,4,1,__stream);
    sVar13 = fread(tmp + 0x10,4,1,__stream);
    sVar14 = fread(tmp + 0x14,4,1,__stream);
    sVar15 = fread(tmp + 0x18,4,1,__stream);
    if (((uint)sVar15 & (uint)sVar14 & (uint)sVar13 & (uint)sVar12 & (uint)sVar10 & 1) == 0) {
      puts("failed read.");
    }
    sVar10 = (ulong)(uint)tmp._24_4_ * 2 + 0x24;
    bVar17 = true;
    pcVar21 = "16-bit binary fuse filter detected.";
    local_128 = 0;
    bVar4 = false;
    goto LAB_001016ac;
  default:
    pcVar21 = "Not a filter file. Cookie found: %llu.\n";
    src = (uint8_t *)cookie;
    goto LAB_00101880;
  }
  bVar17 = false;
LAB_001016ac:
  bVar3 = false;
LAB_00101702:
  puts(pcVar21);
  fclose(__stream);
  iVar5 = open((char *)local_110,0);
  printf("I expect the file to span %zu bytes.\n",sVar10);
  __addr = mmap((void *)0x0,sVar10,1,2,iVar5,0);
  if (__addr == (void *)0xffffffffffffffff) {
    puts("Data can\'t be mapped???");
    return 1;
  }
  puts("memory mapping is a success.");
  cVar11 = local_108;
  if (bVar3) {
    digest._8_8_ = (long)__addr + 0x18;
    digest[0] = (undefined4)local_128;
    digest[1] = local_128._4_4_;
    stack0xffffffffffffffb8 = seed;
    bVar4 = MappeableBloomFilter<12>::Contain((MappeableBloomFilter<12> *)digest,uVar23);
    pcVar21 = "Surely not in the set.";
    if (bVar4) {
      pcVar21 = "Probably in the set.";
    }
    puts(pcVar21);
    cVar11 = local_108;
    goto LAB_00101969;
  }
  if (bVar4) {
    uVar18 = (uVar23 + seed >> 0x21 ^ uVar23 + seed) * -0xae502812aa7333;
    uVar18 = (uVar18 >> 0x21 ^ uVar18) * -0x3b314601e57a13ad;
    uVar19 = uVar18 >> 0x21 ^ uVar18;
    uVar20 = local_128 & 0xffffffff;
    if ((byte)(*(byte *)((long)__addr +
                        (ulong)(uint)((int)(((uint)(uVar19 << 0x15) | (uint)(uVar18 >> 0x2b)) *
                                            uVar20 >> 0x20) + (int)local_128) + 0x18) ^
               *(byte *)((long)__addr + ((uVar19 & 0xffffffff) * uVar20 >> 0x20) + 0x18) ^
              *(byte *)((long)__addr +
                       (ulong)(uint)((int)((uVar19 >> 0x16 & 0xffffffff) * uVar20 >> 0x20) +
                                    (int)local_128 * 2) + 0x18)) !=
        (byte)((byte)(uVar18 >> 0x20) ^ (byte)uVar19)) goto LAB_0010195d;
LAB_0010186d:
    pcVar21 = "Probably in the set.";
  }
  else {
    if (!bVar17) {
      uVar23 = binary_fuse_mix_split(uVar23,(uint64_t)local_c8._vptr_SHA1);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar23;
      uVar22 = local_c8.m_digest[0] + SUB164(ZEXT416(local_c8.m_digest[3]) * auVar2,8);
      if ((byte)(*(byte *)((long)__addr +
                          (ulong)((uint)(uVar23 >> 0x12) & local_c8.m_digest[1] ^ uVar22) + 0x24) ^
                 *(byte *)((long)__addr + SUB168(ZEXT416(local_c8.m_digest[3]) * auVar2,8) + 0x24) ^
                *(byte *)((long)__addr +
                         (ulong)(local_c8.m_digest[1] & (uint)uVar23 ^ local_c8.m_digest[0] + uVar22
                                ) + 0x24)) != (byte)((byte)(uVar23 >> 0x20) ^ (byte)uVar23))
      goto LAB_0010195d;
      goto LAB_0010186d;
    }
    uVar23 = binary_fuse_mix_split(uVar23,tmp._0_8_);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar23;
    uVar22 = tmp._8_4_ + SUB164(ZEXT416((uint)tmp._20_4_) * auVar1,8);
    if ((ushort)(*(ushort *)
                  ((long)__addr + (ulong)((uint)(uVar23 >> 0x12) & tmp._12_4_ ^ uVar22) * 2 + 0x24)
                 ^ *(ushort *)
                    ((long)__addr + SUB168(ZEXT416((uint)tmp._20_4_) * auVar1,8) * 2 + 0x24) ^
                *(ushort *)
                 ((long)__addr + (ulong)(tmp._12_4_ & (uint)uVar23 ^ tmp._8_4_ + uVar22) * 2 + 0x24)
                ) == (ushort)((ushort)(uVar23 >> 0x20) ^ (ushort)uVar23)) goto LAB_0010186d;
LAB_0010195d:
    pcVar21 = "Surely not in the set.";
  }
  puts(pcVar21);
LAB_00101969:
  cVar16 = clock();
  local_110 = (uint8_t *)CONCAT44(local_110._4_4_,(float)(cVar16 - cVar11));
  printf("Processing time %.3f microseconds.\n",
         SUB84(((double)(cVar16 - cVar11) * 1000.0 * 1000.0) / 1000000.0,0));
  printf("Expected number of queries per second: %.3f \n",SUB84((double)(1e+06 / local_110._0_4_),0)
        );
  munmap(__addr,sVar10);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  int c;
  bool shaourinput = false;
  while ((c = getopt(argc, argv, "hs")) != -1)
    switch (c) {
    case 'h':
      printusage(argv[0]);
      return 0;
    case 's':
      shaourinput = true;
      break;
    default:
      printusage(argv[0]);
      return 0;
    }
  if (optind + 1 >= argc) {
    printusage(argv[0]);
    return -1;
  }
  const char *filename = argv[optind];
  printf("using database: %s\n", filename);
  uint64_t hexval;
  if (shaourinput) {
    printf("We are going to hash your input.\n");
    sha1::SHA1 s;
    const char *tobehashed = argv[optind + 1];
    printf("hashing this word: %s (length in bytes = %zu)\n", tobehashed,
           strlen(tobehashed));
    s.processBytes(tobehashed, strlen(tobehashed));
    uint32_t digest[5];
    s.getDigest(digest);
    char tmp[48];
    snprintf(tmp, 45, "%08x %08x %08x %08x %08x", digest[0], digest[1],
             digest[2], digest[3], digest[4]);
    printf("SHA1 hash %s\n", tmp);
    hexval = ((uint64_t)digest[0] << 32) | digest[1];
  } else {
    const char *hashhex = argv[optind + 1];
    if (strlen(hashhex) != 16) {
      printf("bad hex. length is %zu, 16 hexadecimal characters expected.\n", strlen(hashhex));
      printusage(argv[0]);
      return EXIT_FAILURE;
    }
    uint64_t x1 = hex_to_u32_nocheck((const uint8_t *)hashhex);
    uint64_t x2 = hex_to_u32_nocheck((const uint8_t *)hashhex + 4);
    uint64_t x3 = hex_to_u32_nocheck((const uint8_t *)hashhex + 8);
    uint64_t x4 = hex_to_u32_nocheck((const uint8_t *)hashhex + 12);
    if ((x1 | x2 | x3 | x4) > 0xFFFF) {
      printf("bad hex value  %s \n", hashhex);
      return EXIT_FAILURE;
    }
    hexval = (x1 << 48) | (x2 << 32) | (x3 << 16) | x4;
  }
  printf("hexval = 0x%" PRIx64 "\n", hexval);
  uint64_t cookie = 0;

  uint64_t seed = 0;
  uint64_t BlockLength = 0;
  clock_t start = clock();

  // could open the file once (map it), instead of this complicated mess.
  FILE *fp = fopen(filename, "rb");
  if (fp == NULL) {
    printf("Cannot read the input file %s.", filename);
    return EXIT_FAILURE;
  }
  // should be done with an enum:
  bool xor8 = false;
  bool bin16 = false;
  bool bloom12 = false;
  if (fread(&cookie, sizeof(cookie), 1, fp) != 1)
    printf("failed read.\n");
  if (fread(&seed, sizeof(seed), 1, fp) != 1)
    printf("failed read.\n");
  // should be a switch/case.
  if (cookie != 1234569) {
    if(cookie == 1234570) {
      bin16 = true;
    } else  if (cookie == 1234567) {
      xor8 = true;
      if (fread(&BlockLength, sizeof(BlockLength), 1, fp) != 1)
        printf("failed read.\n");

    } else if (cookie == 1234567 + 1) {
      bloom12 = true;
      if (fread(&BlockLength, sizeof(BlockLength), 1, fp) != 1)
        printf("failed read.\n");

    } else {
      printf("Not a filter file. Cookie found: %llu.\n", (long long unsigned int)cookie);
      return EXIT_FAILURE;
    }
  }
  size_t length = 0;
  binary_fuse8_t binfilter;
  binary_fuse16_t binfilter16;

  if (bloom12) {
    length = BlockLength * sizeof(uint64_t) + 3 * sizeof(uint64_t);
  } else if (xor8) {
    length = 3 * BlockLength * sizeof(uint8_t) + 3 * sizeof(uint64_t);
  } else if(bin16) {
    bool isok = true;
    binfilter16.Seed = seed;
    isok &=
        fread(&binfilter16.SegmentLength, sizeof(binfilter16.SegmentLength), 1, fp);
    isok &=
        fread(&binfilter16.SegmentLengthMask, sizeof(binfilter16.SegmentLengthMask), 1, fp);
    isok &=
        fread(&binfilter16.SegmentCount, sizeof(binfilter16.SegmentCount), 1, fp);
    isok &= fread(&binfilter16.SegmentCountLength,
                  sizeof(binfilter16.SegmentCountLength), 1, fp);
    isok &= fread(&binfilter16.ArrayLength, sizeof(binfilter16.ArrayLength), 1, fp);
    if (!isok)
      printf("failed read.\n");
    length =
        sizeof(cookie) + sizeof(binfilter16.Seed) +
        sizeof(binfilter16.SegmentLength) + sizeof(binfilter16.SegmentLengthMask) +
        sizeof(binfilter16.SegmentCount) + sizeof(binfilter16.SegmentCountLength) +
        sizeof(binfilter16.ArrayLength) + sizeof(uint16_t) * binfilter16.ArrayLength;

  } else {
    bool isok = true;
    binfilter.Seed = seed;
    isok &=
        fread(&binfilter.SegmentLength, sizeof(binfilter.SegmentLength), 1, fp);
    isok &=
        fread(&binfilter.SegmentLengthMask, sizeof(binfilter.SegmentLengthMask), 1, fp);
    isok &=
        fread(&binfilter.SegmentCount, sizeof(binfilter.SegmentCount), 1, fp);
    isok &= fread(&binfilter.SegmentCountLength,
                  sizeof(binfilter.SegmentCountLength), 1, fp);
    isok &= fread(&binfilter.ArrayLength, sizeof(binfilter.ArrayLength), 1, fp);
    if (!isok)
      printf("failed read.\n");
    length =
        sizeof(cookie) + sizeof(binfilter.Seed) +
        sizeof(binfilter.SegmentLength) + sizeof(binfilter.SegmentLengthMask) +
        sizeof(binfilter.SegmentCount) + sizeof(binfilter.SegmentCountLength) +
        sizeof(binfilter.ArrayLength) + sizeof(uint8_t) * binfilter.ArrayLength;
  }

  if (bloom12)
    printf("Bloom filter detected.\n");
  else if (xor8)
    printf("Xor filter detected.\n");
  else if(bin16)
    printf("16-bit binary fuse filter detected.\n");
  else
    printf("8-bit binary fuse filter detected.\n");
  fclose(fp);
  int fd = open(filename, O_RDONLY);
  bool shared = false;

  printf("I expect the file to span %zu bytes.\n", length);
// for Linux:
#if defined(__linux__) && defined(USE_POPULATE)
  uint8_t *addr = (uint8_t *)(mmap(
      NULL, length, PROT_READ,
      MAP_FILE | (shared ? MAP_SHARED : MAP_PRIVATE) | MAP_POPULATE, fd, 0));
#else
  uint8_t *addr =
      (uint8_t *)(mmap(NULL, length, PROT_READ,
                       MAP_FILE | (shared ? MAP_SHARED : MAP_PRIVATE), fd, 0));
#endif
  if (addr == MAP_FAILED) {
    printf("Data can't be mapped???\n");
    return EXIT_FAILURE;
  } else {
    printf("memory mapping is a success.\n");
  }
  if (bloom12) {
    MappeableBloomFilter<12> filter(
        BlockLength, seed, (const uint64_t *)(addr + 3 * sizeof(uint64_t)));
    if (filter.Contain(hexval)) {
      printf("Probably in the set.\n");
    } else {
      printf("Surely not in the set.\n");
    }
  } else if (xor8) {
    xor8_t filter;
    filter.seed = seed;
    filter.blockLength = BlockLength;
    filter.fingerprints = addr + 3 * sizeof(uint64_t);
    if (xor8_contain(hexval, &filter)) {
      printf("Probably in the set.\n");
    } else {
      printf("Surely not in the set.\n");
    }
  } else if (bin16) {
    binfilter16.Fingerprints = reinterpret_cast<uint16_t*>(
        addr + sizeof(cookie) + sizeof(binfilter16.Seed) +
        sizeof(binfilter16.SegmentLength) + sizeof(binfilter16.SegmentLengthMask) +
        sizeof(binfilter16.SegmentCount) + sizeof(binfilter16.SegmentCountLength) +
        sizeof(binfilter16.ArrayLength));
    if (binary_fuse16_contain(hexval, &binfilter16)) {
      printf("Probably in the set.\n");
    } else {
      printf("Surely not in the set.\n");
    }
  } else {
    binfilter.Fingerprints =
        addr + sizeof(cookie) + sizeof(binfilter.Seed) +
        sizeof(binfilter.SegmentLength) + sizeof(binfilter.SegmentLengthMask) +
        sizeof(binfilter.SegmentCount) + sizeof(binfilter.SegmentCountLength) +
        sizeof(binfilter.ArrayLength);
    if (binary_fuse8_contain(hexval, &binfilter)) {
      printf("Probably in the set.\n");
    } else {
      printf("Surely not in the set.\n");
    }
  }
  clock_t end = clock();

  printf("Processing time %.3f microseconds.\n",
         (float)(end - start) * 1000.0 * 1000.0 / CLOCKS_PER_SEC);
  printf("Expected number of queries per second: %.3f \n",
         (float)CLOCKS_PER_SEC / (end - start));
  munmap(addr, length);
  return EXIT_SUCCESS;
}